

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

bool __thiscall Jinx::Impl::Parser::ParseStatement(Parser *this)

{
  VariableStackFrame *this_00;
  size_t *pos;
  pointer pSVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  VisibilityType scope;
  uint32_t uVar5;
  mapped_type *this_01;
  char *pcVar6;
  byte bVar7;
  byte bVar8;
  bool bVar9;
  byte bVar10;
  bool readOnly;
  initializer_list<Jinx::Impl::SymbolType> symbols;
  PropertyName propertyName;
  FunctionMatch functionMatch;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *local_b0;
  undefined1 local_a8 [16];
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_98 [2];
  FunctionMatch local_48;
  
  if (this->m_error != false) {
    return false;
  }
  CheckFunctionCall(&local_48,this,false,(this->m_currentSymbol)._M_current,
                    (this->m_symbolList->
                    super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                    _M_impl.super__Vector_impl_data._M_finish);
  if (local_48.signature != (FunctionSignature *)0x0) {
    ParseFunctionCall(this,&local_48);
    EmitOpcode(this,Pop);
    bVar9 = false;
    Expect(this,NewLine,(char *)0x0);
    goto LAB_0012472b;
  }
  bVar9 = true;
  if (((this->m_error == false) &&
      (pSVar1 = (this->m_currentSymbol)._M_current,
      pSVar1 != (this->m_symbolList->
                super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                _M_impl.super__Vector_impl_data._M_finish)) && (pSVar1->type == Set)) {
    this->m_lastLine = pSVar1->lineNumber;
    (this->m_currentSymbol)._M_current = pSVar1 + 1;
    bVar9 = false;
  }
  scope = ParseScope(this);
  bVar4 = this->m_error;
  if (((bVar4 == false) &&
      (pSVar1 = (this->m_currentSymbol)._M_current,
      pSVar1 != (this->m_symbolList->
                super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                _M_impl.super__Vector_impl_data._M_finish)) && (pSVar1->type == Readonly)) {
    this->m_lastLine = pSVar1->lineNumber;
    (this->m_currentSymbol)._M_current = pSVar1 + 1;
    readOnly = true;
  }
  else {
    readOnly = false;
  }
  if ((scope == Local & readOnly) == 0) {
    if (((bVar4 == false) &&
        (pSVar1 = (this->m_currentSymbol)._M_current,
        pSVar1 != (this->m_symbolList->
                  super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                  _M_impl.super__Vector_impl_data._M_finish)) && (pSVar1->type == Function)) {
      this->m_lastLine = pSVar1->lineNumber;
      (this->m_currentSymbol)._M_current = pSVar1 + 1;
      ParseFunctionDefinition(this,scope);
LAB_00124722:
      bVar10 = 0;
    }
    else {
      if (((!bVar9 && bVar4 == false) &&
          (pSVar1 = (this->m_currentSymbol)._M_current,
          pSVar1 != (this->m_symbolList->
                    super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                    _M_impl.super__Vector_impl_data._M_finish)) && (pSVar1->type == NameValue)) {
        bVar9 = std::operator==(&((this->m_currentSymbol)._M_current)->text,
                                &((this->m_library).
                                  super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->m_name);
        if (bVar9) {
          pcVar6 = "Illegal use of library name in identifier";
          goto LAB_00123e98;
        }
        if (scope == Local) {
          bVar9 = CheckProperty(this,(this->m_currentSymbol)._M_current,(size_t *)0x0);
          if (bVar9) {
            ParsePropertyName((PropertyName *)local_a8,this);
            if ((bool)local_a8[0xc] == true) {
              Error<>(this,"Can\'t change readonly property");
            }
            else {
              uVar5 = ParseSubscriptSet(this);
              Expect(this,To,(char *)0x0);
              ParseExpression(this,(this->m_symbolList->
                                   super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                   )._M_impl.super__Vector_impl_data._M_finish);
              Expect(this,NewLine,(char *)0x0);
              if (uVar5 == 0) {
                EmitOpcode(this,SetProp);
              }
              else {
                EmitOpcode(this,SetPropKeyVal);
                local_b0 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                           CONCAT44(local_b0._4_4_,uVar5);
                Buffer::Write((this->m_writer).m_buffer.
                              super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              &(this->m_writer).m_pos,&local_b0,4);
              }
              local_b0 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                         local_a8._0_8_;
              Buffer::Write((this->m_writer).m_buffer.
                            super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            &(this->m_writer).m_pos,&local_b0,8);
              local_b0 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                         local_a8._0_8_;
              this_01 = std::
                        map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_8192UL,_16UL>_>
                        ::operator[](&this->m_idNameMap,(key_type *)&local_b0);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
              _M_assign(this_01,local_98);
            }
            PropertyName::~PropertyName((PropertyName *)local_a8);
            bVar7 = 0;
            bVar8 = 0;
            bVar10 = 0;
            if ((bool)local_a8[0xc] == false) goto LAB_00124725;
            goto LAB_00124728;
          }
          local_b0 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                     0x140000003f;
          symbols._M_len = 2;
          symbols._M_array = (iterator)&local_b0;
          ParseMultiName_abi_cxx11_((String *)local_a8,this,symbols);
          uVar5 = ParseSubscriptSet(this);
          Expect(this,To,(char *)0x0);
          ParseExpression(this,(this->m_symbolList->
                               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                               )._M_impl.super__Vector_impl_data._M_finish);
          Expect(this,NewLine,"Unable to parse expression");
          VariableAssign(this,(String *)local_a8);
          if (uVar5 == 0) {
            EmitOpcode(this,SetVar);
          }
          else {
            EmitOpcode(this,SetVarKeyVal);
            local_b0 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                       CONCAT44(local_b0._4_4_,uVar5);
            Buffer::Write((this->m_writer).m_buffer.
                          super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          &(this->m_writer).m_pos,&local_b0,4);
          }
          local_b0 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                     VariableNameToRuntimeID(this,(String *)local_a8);
          Buffer::Write((this->m_writer).m_buffer.
                        super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        &(this->m_writer).m_pos,&local_b0,8);
LAB_00124274:
          if ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_a8._0_8_
              != local_98) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
            _M_destroy((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                       local_a8,(size_type)local_98[0]._M_dataplus._M_p);
          }
        }
        else {
          ParsePropertyDeclaration(this,scope,readOnly);
        }
        goto LAB_00124722;
      }
      if (scope != Local) {
        local_a8._0_8_ = "private";
        if (scope == Public) {
          local_a8._0_8_ = "public";
        }
        Error<char_const*>(this,"Invalid symbol after scope specifier \'%s\'",(char **)local_a8);
        goto LAB_00124722;
      }
      pcVar6 = "Unknown symbol in statement";
      if (bVar4 != false) goto LAB_0012471a;
      pSVar1 = (this->m_currentSymbol)._M_current;
      if ((pSVar1 == (this->m_symbolList->
                     super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                     _M_impl.super__Vector_impl_data._M_finish) || (pSVar1->type != Begin)) {
        pSVar1 = (this->m_currentSymbol)._M_current;
        if ((pSVar1 == (this->m_symbolList->
                       super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)
                       ._M_impl.super__Vector_impl_data._M_finish) || (pSVar1->type != If)) {
          pSVar1 = (this->m_currentSymbol)._M_current;
          if ((pSVar1 == (this->m_symbolList->
                         super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                         )._M_impl.super__Vector_impl_data._M_finish) || (pSVar1->type != Loop)) {
            pSVar1 = (this->m_currentSymbol)._M_current;
            if ((pSVar1 == (this->m_symbolList->
                           super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                           )._M_impl.super__Vector_impl_data._M_finish) || (pSVar1->type != Erase))
            {
              pSVar1 = (this->m_currentSymbol)._M_current;
              if (((pSVar1 == (this->m_symbolList->
                              super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                              )._M_impl.super__Vector_impl_data._M_finish) ||
                  (pSVar1->type != Increment)) &&
                 ((pSVar1 = (this->m_currentSymbol)._M_current,
                  pSVar1 == (this->m_symbolList->
                            super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                            )._M_impl.super__Vector_impl_data._M_finish ||
                  (pSVar1->type != Decrement)))) {
                pSVar1 = (this->m_currentSymbol)._M_current;
                if ((pSVar1 != (this->m_symbolList->
                               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                               )._M_impl.super__Vector_impl_data._M_finish) &&
                   (pSVar1->type == Return)) {
                  this->m_lastLine = pSVar1->lineNumber;
                  (this->m_currentSymbol)._M_current = pSVar1 + 1;
                  bVar9 = VariableStackFrame::IsRootFrame(&this->m_variableStackFrame);
                  if (bVar9) {
                    if (((this->m_error != false) ||
                        (pSVar1 = (this->m_currentSymbol)._M_current,
                        pSVar1 == (this->m_symbolList->
                                  super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                  )._M_impl.super__Vector_impl_data._M_finish)) ||
                       (pSVar1->type != NewLine)) {
                      LogWriteLine(Warning,"Return values at root scope do nothing");
                      ParseExpression(this,(this->m_symbolList->
                                           super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                           )._M_impl.super__Vector_impl_data._M_finish);
                    }
                    EmitOpcode(this,Exit);
                  }
                  else {
                    if (((this->m_error == false) &&
                        (pSVar1 = (this->m_currentSymbol)._M_current,
                        pSVar1 != (this->m_symbolList->
                                  super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                  )._M_impl.super__Vector_impl_data._M_finish)) &&
                       (pSVar1->type == NewLine)) {
                      EmitOpcode(this,PushVal);
                      local_a8._0_8_ = local_a8._0_8_ & 0xffffffff00000000;
                      Variant::SetNull((Variant *)local_a8);
                      Variant::Write((Variant *)local_a8,&this->m_writer);
                      Variant::~Variant((Variant *)local_a8);
                    }
                    else {
                      ParseExpression(this,(this->m_symbolList->
                                           super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                           )._M_impl.super__Vector_impl_data._M_finish);
                    }
                    EmitOpcode(this,Return);
                  }
                  bVar10 = 1;
                  if (((this->m_error == false) &&
                      (pSVar1 = (this->m_currentSymbol)._M_current,
                      pSVar1 != (this->m_symbolList->
                                super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                )._M_impl.super__Vector_impl_data._M_finish)) &&
                     (pSVar1->type == NewLine)) {
                    this->m_lastLine = pSVar1->lineNumber;
                    (this->m_currentSymbol)._M_current = pSVar1 + 1;
                  }
                  goto LAB_00124725;
                }
                pSVar1 = (this->m_currentSymbol)._M_current;
                if ((pSVar1 == (this->m_symbolList->
                               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                               )._M_impl.super__Vector_impl_data._M_finish) ||
                   (pSVar1->type != Break)) {
                  pSVar1 = (this->m_currentSymbol)._M_current;
                  if ((pSVar1 == (this->m_symbolList->
                                 super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                 )._M_impl.super__Vector_impl_data._M_finish) ||
                     (pSVar1->type != Wait)) {
                    pSVar1 = (this->m_currentSymbol)._M_current;
                    if ((pSVar1 != (this->m_symbolList->
                                   super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                   )._M_impl.super__Vector_impl_data._M_finish) &&
                       (pSVar1->type == External)) {
                      this->m_lastLine = pSVar1->lineNumber;
                      (this->m_currentSymbol)._M_current = pSVar1 + 1;
                      bVar9 = CheckProperty(this,pSVar1 + 1,(size_t *)0x0);
                      ParseMultiName_abi_cxx11_
                                ((String *)local_a8,this,
                                 (initializer_list<Jinx::Impl::SymbolType>)ZEXT816(0));
                      this_00 = &this->m_variableStackFrame;
                      bVar4 = VariableStackFrame::IsRootFrame(this_00);
                      if (bVar4) {
                        bVar4 = VariableStackFrame::IsRootScope(this_00);
                        if (bVar4) {
                          if (bVar9) {
                            local_b0 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                        *)local_a8._0_8_;
                            Error<char_const*>(this,
                                               "External variable \'%s\' is already a property name"
                                               ,(char **)&local_b0);
                          }
                          else {
                            bVar9 = VariableStackFrame::VariableExists(this_00,(String *)local_a8);
                            if (bVar9) {
                              local_b0 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                          *)local_a8._0_8_;
                              Error<char_const*>(this,"Variable \'%s\' already exists",
                                                 (char **)&local_b0);
                            }
                            else {
                              bVar9 = VariableStackFrame::VariableAssign(this_00,(String *)local_a8)
                              ;
                              if (!bVar9) {
                                local_b0 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                            *)local_a8._0_8_;
                                Error<char_const*>(this,"Error creating external variable \'%s\'",
                                                   (char **)&local_b0);
                              }
                            }
                          }
                        }
                        else {
                          local_b0 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                      *)local_a8._0_8_;
                          Error<char_const*>(this,
                                             "External variable \'%s\' must be declared at the root scope"
                                             ,(char **)&local_b0);
                        }
                      }
                      else {
                        local_b0 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                    *)local_a8._0_8_;
                        Error<char_const*>(this,
                                           "External variable \'%s\' can\'t be declared in a function"
                                           ,(char **)&local_b0);
                      }
                      Expect(this,NewLine,(char *)0x0);
                      goto LAB_00124274;
                    }
                  }
                  else {
                    this->m_lastLine = pSVar1->lineNumber;
                    (this->m_currentSymbol)._M_current = pSVar1 + 1;
                    pcVar6 = "Unexpected symbol after wait";
                    pSVar1 = (this->m_currentSymbol)._M_current;
                    if ((pSVar1 != (this->m_symbolList->
                                   super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                   )._M_impl.super__Vector_impl_data._M_finish) &&
                       (pSVar1->type == NewLine)) {
                      this->m_lastLine = pSVar1->lineNumber;
                      (this->m_currentSymbol)._M_current = pSVar1 + 1;
                      EmitOpcode(this,Wait);
                      goto LAB_00124722;
                    }
                    pSVar1 = (this->m_currentSymbol)._M_current;
                    if (((pSVar1 != (this->m_symbolList->
                                    super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                    )._M_impl.super__Vector_impl_data._M_finish) &&
                        (pSVar1->type == Until)) ||
                       ((pSVar1 = (this->m_currentSymbol)._M_current,
                        pSVar1 != (this->m_symbolList->
                                  super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                  )._M_impl.super__Vector_impl_data._M_finish &&
                        (pSVar1->type == While)))) {
                      pSVar1 = (this->m_currentSymbol)._M_current;
                      if ((pSVar1 == (this->m_symbolList->
                                     super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                     )._M_impl.super__Vector_impl_data._M_finish) ||
                         (pSVar1->type != Until)) {
                        bVar10 = 0;
                      }
                      else {
                        this->m_lastLine = pSVar1->lineNumber;
                        (this->m_currentSymbol)._M_current = pSVar1 + 1;
                        bVar10 = 1;
                      }
                      sVar2 = (this->m_writer).m_pos;
                      if (bVar10 == 0) {
                        Expect(this,While,(char *)0x0);
                      }
                      ParseExpression(this,(this->m_symbolList->
                                           super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                           )._M_impl.super__Vector_impl_data._M_finish);
                      bVar9 = Expect(this,NewLine,(char *)0x0);
                      if (bVar9) {
                        EmitOpcode(this,(uint)bVar10 * 2 + JumpFalse);
                        pos = &(this->m_writer).m_pos;
                        sVar3 = (this->m_writer).m_pos;
                        local_a8._0_8_ = local_a8._0_8_ & 0xffffffff00000000;
                        Buffer::Write((this->m_writer).m_buffer.
                                      super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr,pos,local_a8,4);
                        EmitOpcode(this,Wait);
                        EmitOpcode(this,Jump);
                        local_a8._0_4_ = (ValueType)sVar2;
                        Buffer::Write((this->m_writer).m_buffer.
                                      super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr,pos,local_a8,4);
                        sVar2 = (this->m_writer).m_pos;
                        (this->m_writer).m_pos = sVar3;
                        local_a8._0_4_ = (int)sVar2;
                        Buffer::Write((this->m_writer).m_buffer.
                                      super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr,pos,local_a8,4);
                        *pos = sVar2;
                        bVar7 = 0;
                        bVar8 = 0;
                        bVar10 = 0;
                        if (!bVar9) goto LAB_00124728;
                        goto LAB_00124725;
                      }
                      goto LAB_00123ea0;
                    }
                  }
LAB_0012471a:
                  Error<>(this,pcVar6);
                }
                else {
                  this->m_lastLine = pSVar1->lineNumber;
                  (this->m_currentSymbol)._M_current = pSVar1 + 1;
                  Expect(this,NewLine,(char *)0x0);
                  EmitOpcode(this,Jump);
                  sVar2 = (this->m_writer).m_pos;
                  local_a8._0_8_ = (ulong)(uint)local_a8._4_4_ << 0x20;
                  Buffer::Write((this->m_writer).m_buffer.
                                super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                                &(this->m_writer).m_pos,local_a8,4);
                  this->m_breakAddress = sVar2;
                }
              }
              else {
                ParseIncDec(this);
              }
            }
            else {
              this->m_lastLine = pSVar1->lineNumber;
              (this->m_currentSymbol)._M_current = pSVar1 + 1;
              ParseErase(this);
            }
          }
          else {
            this->m_lastLine = pSVar1->lineNumber;
            (this->m_currentSymbol)._M_current = pSVar1 + 1;
            ParseLoop(this);
          }
        }
        else {
          this->m_lastLine = pSVar1->lineNumber;
          (this->m_currentSymbol)._M_current = pSVar1 + 1;
          ParseIfElse(this);
        }
        goto LAB_00124722;
      }
      this->m_lastLine = pSVar1->lineNumber;
      (this->m_currentSymbol)._M_current = pSVar1 + 1;
      Expect(this,NewLine,(char *)0x0);
      ParseBlock(this);
      Expect(this,End,(char *)0x0);
      Expect(this,NewLine,(char *)0x0);
      bVar10 = 0;
    }
LAB_00124725:
    bVar7 = bVar10;
    bVar8 = 1;
  }
  else {
    pcVar6 = "The \'readonly\' keyword must follow a private or public keyword";
LAB_00123e98:
    Error<>(this,pcVar6);
LAB_00123ea0:
    bVar8 = 0;
    bVar7 = 0;
  }
LAB_00124728:
  bVar9 = (bool)(bVar8 & bVar7);
LAB_0012472b:
  std::
  _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ::~_Vector_base(&local_48.partData.
                   super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                 );
  return bVar9;
}

Assistant:

inline_t bool Parser::ParseStatement()
	{
		// No need to continue if an error has been flagged
		if (m_error)
			return false;

		bool returnedValue = false;

		// Functions signatures have precedence over everything, so check for a 
		// potential signature match before anything else.
		const auto functionMatch = CheckFunctionCall();
		if (functionMatch.signature)
		{
			// We found a valid function signature that matches the current token(s)
			ParseFunctionCall(functionMatch);

			// Since all functions return a value, we need to discard the return
			// value not on the stack, since we're not assigning it to a variable.
			EmitOpcode(Opcode::Pop);
			Expect(SymbolType::NewLine);
		}
		else
		{
			bool set = Accept(SymbolType::Set);

			// Parse scope level
			VisibilityType scope = ParseScope();

			// Parse optional readonly, which can only apply to properties
			bool readOnly = Accept(SymbolType::Readonly);
			if (readOnly)
			{
				if (scope == VisibilityType::Local)
				{
					Error("The 'readonly' keyword must follow a private or public keyword");
					return false;
				}
			}

			if (Accept(SymbolType::Function))
			{
				// We're parsing a function definition
				ParseFunctionDefinition(scope);
			}
			else if (set && CheckName())
			{
				// Can't use the current library name or preface the variable with it
				if (m_currentSymbol->text == m_library->GetName())
				{
					Error("Illegal use of library name in identifier");
					return false;
				}

				// We're declaring a new property if we see a non-local scope declaration
				if (scope != VisibilityType::Local)
				{
					ParsePropertyDeclaration(scope, readOnly);
				}
				// Either this is an existing property or a variable
				else
				{
					// Check to see if this is an existing property
					if (CheckProperty())
					{
						// Get the property name
						auto propertyName = ParsePropertyName();

						// Make sure we're not trying to assign a value to a readonly property
						if (propertyName.IsReadOnly())
						{
							Error("Can't change readonly property");
							return false;
						}

						// Check for subscript operators
						uint32_t subscripts = ParseSubscriptSet();

						// Check for a 'to' statement
						Expect(SymbolType::To);

						// Parse expression
						ParseExpression();
						Expect(SymbolType::NewLine);

						// Assign property
						if (subscripts)
						{
							EmitOpcode(Opcode::SetPropKeyVal);
							EmitCount(subscripts);
						}
						else
							EmitOpcode(Opcode::SetProp);

						EmitId(propertyName.GetId());
						m_idNameMap[propertyName.GetId()] = propertyName.GetName();
					}
					// Otherwise we're just dealing with an ordinary variable
					else
					{
						// Get the variable name
						String name = ParseMultiName({ SymbolType::To, SymbolType::SquareOpen });

						// Check for subscript operator
						uint32_t subscripts = ParseSubscriptSet();

						// Check for a 'to' statement
						Expect(SymbolType::To);

						// Parse expression
						ParseExpression();
						Expect(SymbolType::NewLine, "Unable to parse expression");

						// Add to variable table
						VariableAssign(name);

						// Assign a variable. 
						if (subscripts)
						{
							EmitOpcode(Opcode::SetVarKeyVal);
							EmitCount(subscripts);
						}
						else
							EmitOpcode(Opcode::SetVar);
						EmitId(VariableNameToRuntimeID(name));
					}
				}
			}
			else if (scope == VisibilityType::Local)
			{
				if (Accept(SymbolType::Begin))
				{
					// We're parsing a begin/end block
					Expect(SymbolType::NewLine);
					ParseBlock();
					Expect(SymbolType::End);
					Expect(SymbolType::NewLine);
				}
				else if (Accept(SymbolType::If))
				{
					// We're parsing an if or if/else block
					ParseIfElse();
				}
				else if (Accept(SymbolType::Loop))
				{
					// We're parsing a loop block
					ParseLoop();
				}
				else if (Accept(SymbolType::Erase))
				{
					// We're parsing an erase operation
					ParseErase();
				}
				else if (Check(SymbolType::Increment) || Check(SymbolType::Decrement))
				{
					// We're parsing an increment or decrement statement
					ParseIncDec();
				}
				else if (Accept(SymbolType::Return))
				{
					// We've hit a return value.  There are different behaviors depending whether or
					// not we're at the base scope or not.
					if (m_variableStackFrame.IsRootFrame())
					{
						if (!Check(SymbolType::NewLine))
						{
							LogWriteLine(LogLevel::Warning, "Return values at root scope do nothing");
							ParseExpression();
						}
						EmitOpcode(Opcode::Exit);
						Accept(SymbolType::NewLine);
						returnedValue = true;
					}
					else
					{
						if (!Check(SymbolType::NewLine))
						{
							ParseExpression();
						}
						else
						{
							EmitOpcode(Opcode::PushVal);
							EmitValue(nullptr);
						}
						EmitOpcode(Opcode::Return);
						Accept(SymbolType::NewLine);
						returnedValue = true;
					}
				}
				else if (Accept(SymbolType::Break))
				{
					// We've hit a break statement
					Expect(SymbolType::NewLine);
					EmitOpcode(Opcode::Jump);
					m_breakAddress = EmitAddressPlaceholder();
				}
				else if (Accept(SymbolType::Wait))
				{
					// Check for basic wait statement
					if (Accept(SymbolType::NewLine))
						EmitOpcode(Opcode::Wait);
					else if (Check(SymbolType::Until) || Check(SymbolType::While))
					{
						// Store expression address
						auto expressionAddress = m_writer.Tell();

						// Check which keyword was used
						bool jumpTrue = Accept(SymbolType::Until);
						if (!jumpTrue)
							Expect(SymbolType::While);

						// Parse the expression to check for wait
						ParseExpression();
						if (!Expect(SymbolType::NewLine))
							return false;

						// Add jump if false/true over wait statement depending on keyword
						EmitOpcode(jumpTrue ? Opcode::JumpTrue : Opcode::JumpFalse);

						// Mark placeholder for later jump address insertion
						auto addressPlaceholder = EmitAddressPlaceholder();

						// Wait statement is executed if expression is true
						EmitOpcode(Opcode::Wait);
						EmitOpcode(Opcode::Jump);
						EmitAddress(expressionAddress);

						// Backfill placeholder at end of conditional wait statement
						EmitAddressBackfill(addressPlaceholder);
					}
					else
					{
						Error("Unexpected symbol after wait");
					}
				}
				else if (Accept(SymbolType::External))
				{
					// First check to see if this collides with an existing property name
					bool propExists = CheckProperty();

					// Get the variable name
					String name = ParseMultiName({ });

					// Validate the name is legal and register it as a variable name
					if (!m_variableStackFrame.IsRootFrame())
						Error("External variable '%s' can't be declared in a function", name.c_str());
					else if (!m_variableStackFrame.IsRootScope())
						Error("External variable '%s' must be declared at the root scope", name.c_str());
					else if (propExists)
						Error("External variable '%s' is already a property name", name.c_str());
					else if (m_variableStackFrame.VariableExists(name))
						Error("Variable '%s' already exists", name.c_str());
					else if (!m_variableStackFrame.VariableAssign(name))
						Error("Error creating external variable '%s'", name.c_str());

					Expect(SymbolType::NewLine);
				}
				else
				{
					Error("Unknown symbol in statement");
				}
			}
			else
			{
				Error("Invalid symbol after scope specifier '%s'", scope == VisibilityType::Public ? "public" : "private");
			}
		}

		// This is not an error value, but signals whether we've returned a value from this statement
		return returnedValue;
	}